

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O0

HighsStatus __thiscall Highs::changeObjectiveSense(Highs *this,ObjSense sense)

{
  HighsStatus HVar1;
  int in_ESI;
  long in_RDI;
  HighsStatus in_stack_0000003c;
  Highs *in_stack_00000040;
  undefined4 in_stack_fffffffffffffff0;
  
  if ((in_ESI == 1) != (*(int *)(in_RDI + 0x228) == 1)) {
    *(int *)(in_RDI + 0x228) = in_ESI;
    clearDerivedModelProperties((Highs *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
    invalidateModelStatusSolutionAndInfo((Highs *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
  }
  HVar1 = returnFromHighs(in_stack_00000040,in_stack_0000003c);
  return HVar1;
}

Assistant:

HighsStatus Highs::changeObjectiveSense(const ObjSense sense) {
  if ((sense == ObjSense::kMinimize) !=
      (model_.lp_.sense_ == ObjSense::kMinimize)) {
    model_.lp_.sense_ = sense;
    // Nontrivial change
    clearDerivedModelProperties();
    invalidateModelStatusSolutionAndInfo();
  }
  return returnFromHighs(HighsStatus::kOk);
}